

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O1

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,true,true,false>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  SVOBitset *pSVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  HomomorphismModel *this_00;
  ulong uVar10;
  uint g;
  SVOBitset check_d_values;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  
  bVar2 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,current_assignment->pattern_vertex,d->v);
  if ((bVar2 & 1) == 0) {
    pSVar6 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::intersect_with_complement(&d->values,pSVar6);
  }
  else {
    pSVar6 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(&d->values,pSVar6);
  }
  bVar3 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,d->v,current_assignment->pattern_vertex);
  if ((bVar3 & 1) == 0) {
    pSVar6 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::intersect_with_complement(&d->values,pSVar6);
  }
  else {
    pSVar6 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(&d->values,pSVar6);
  }
  this_00 = this->model;
  if (1 < this_00->max_graphs) {
    g = 1;
    do {
      if ((bVar2 >> (g & 0x1f) & 1) != 0) {
        pSVar6 = HomomorphismModel::target_graph_row(this_00,g,current_assignment->target_vertex);
        SVOBitset::operator&=(&d->values,pSVar6);
      }
      g = g + 1;
      this_00 = this->model;
    } while (g < this_00->max_graphs);
  }
  if ((bVar2 & 1) != 0) {
    SVOBitset::SVOBitset((SVOBitset *)&local_b8,&d->values);
    iVar4 = HomomorphismModel::pattern_edge_label
                      (this->model,current_assignment->pattern_vertex,d->v);
    uVar10 = (ulong)local_38;
    uVar7 = &local_b8;
    if (0x10 < uVar10) {
      uVar7 = local_b8.short_data[0];
    }
    iVar5 = -1;
    if (uVar10 != 0) {
      lVar9 = 0;
LAB_00143a67:
      uVar1 = *(ulong *)uVar7;
      if (uVar1 == 0) goto code_r0x00143a70;
      iVar5 = 0;
      for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar5 = iVar5 + 1;
      }
      iVar5 = iVar5 - (int)lVar9;
    }
LAB_00143a89:
    if (iVar5 != -1) {
      do {
        uVar7 = &local_b8;
        if (0x10 < local_38) {
          uVar7 = local_b8.long_data;
        }
        bVar2 = (byte)iVar5 & 0x3f;
        uVar10 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
        iVar8 = iVar5 + 0x3f;
        if (-1 < iVar5) {
          iVar8 = iVar5;
        }
        *(ulong *)(uVar7 + (long)(iVar8 >> 6) * 8) =
             *(ulong *)(uVar7 + (long)(iVar8 >> 6) * 8) & uVar10;
        iVar5 = HomomorphismModel::target_edge_label
                          (this->model,current_assignment->target_vertex,iVar5);
        if (iVar5 != iVar4) {
          pSVar6 = &d->values;
          if (0x10 < (d->values).n_words) {
            pSVar6 = (SVOBitset *)(d->values)._data.short_data[0];
          }
          (pSVar6->_data).short_data[iVar8 >> 6] = (pSVar6->_data).short_data[iVar8 >> 6] & uVar10;
        }
        uVar10 = (ulong)local_38;
        uVar7 = &local_b8;
        if (0x10 < uVar10) {
          uVar7 = local_b8.long_data;
        }
        iVar5 = -1;
        if (uVar10 != 0) {
          lVar9 = 0;
LAB_00143b19:
          uVar1 = *(ulong *)uVar7;
          if (uVar1 == 0) goto code_r0x00143b21;
          iVar5 = 0;
          for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          iVar5 = iVar5 - (int)lVar9;
        }
LAB_00143b3a:
      } while (iVar5 != -1);
    }
    if ((0x10 < local_38) &&
       ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
        (anon_union_128_2_84168a9f_for__data *)0x0)) {
      operator_delete__(local_b8.long_data);
    }
  }
  bVar2 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,d->v,current_assignment->pattern_vertex);
  if ((bVar2 & 1) != 0) {
    SVOBitset::SVOBitset((SVOBitset *)&local_b8,&d->values);
    iVar4 = HomomorphismModel::pattern_edge_label
                      (this->model,d->v,current_assignment->pattern_vertex);
    uVar10 = (ulong)local_38;
    uVar7 = &local_b8;
    if (0x10 < uVar10) {
      uVar7 = local_b8.short_data[0];
    }
    iVar5 = -1;
    if (uVar10 != 0) {
      lVar9 = 0;
LAB_00143bbc:
      uVar1 = *(ulong *)uVar7;
      if (uVar1 == 0) goto code_r0x00143bc5;
      iVar5 = 0;
      for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar5 = iVar5 + 1;
      }
      iVar5 = iVar5 - (int)lVar9;
    }
LAB_00143bde:
    if (iVar5 != -1) {
      do {
        uVar7 = &local_b8;
        if (0x10 < local_38) {
          uVar7 = local_b8.long_data;
        }
        bVar2 = (byte)iVar5 & 0x3f;
        uVar10 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
        iVar8 = iVar5 + 0x3f;
        if (-1 < iVar5) {
          iVar8 = iVar5;
        }
        *(ulong *)(uVar7 + (long)(iVar8 >> 6) * 8) =
             *(ulong *)(uVar7 + (long)(iVar8 >> 6) * 8) & uVar10;
        iVar5 = HomomorphismModel::target_edge_label
                          (this->model,iVar5,current_assignment->target_vertex);
        if (iVar5 != iVar4) {
          pSVar6 = &d->values;
          if (0x10 < (d->values).n_words) {
            pSVar6 = (SVOBitset *)(d->values)._data.short_data[0];
          }
          (pSVar6->_data).short_data[iVar8 >> 6] = (pSVar6->_data).short_data[iVar8 >> 6] & uVar10;
        }
        uVar10 = (ulong)local_38;
        uVar7 = &local_b8;
        if (0x10 < uVar10) {
          uVar7 = local_b8.long_data;
        }
        iVar5 = -1;
        if (uVar10 != 0) {
          lVar9 = 0;
LAB_00143c6e:
          uVar1 = *(ulong *)uVar7;
          if (uVar1 == 0) goto code_r0x00143c76;
          iVar5 = 0;
          for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
            iVar5 = iVar5 + 1;
          }
          iVar5 = iVar5 - (int)lVar9;
        }
LAB_00143c8f:
      } while (iVar5 != -1);
    }
    if ((0x10 < local_38) &&
       ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
        (anon_union_128_2_84168a9f_for__data *)0x0)) {
      operator_delete__(local_b8.long_data);
    }
  }
  return;
code_r0x00143a70:
  lVar9 = lVar9 + -0x40;
  uVar7 = uVar7 + 8;
  if (uVar10 * 0x40 + lVar9 == 0) goto LAB_00143a89;
  goto LAB_00143a67;
code_r0x00143b21:
  lVar9 = lVar9 + -0x40;
  uVar7 = uVar7 + 8;
  if (uVar10 * 0x40 + lVar9 == 0) goto LAB_00143b3a;
  goto LAB_00143b19;
code_r0x00143bc5:
  lVar9 = lVar9 + -0x40;
  uVar7 = uVar7 + 8;
  if (uVar10 * 0x40 + lVar9 == 0) goto LAB_00143bde;
  goto LAB_00143bbc;
code_r0x00143c76:
  lVar9 = lVar9 + -0x40;
  uVar7 = uVar7 + 8;
  if (uVar10 * 0x40 + lVar9 == 0) goto LAB_00143c8f;
  goto LAB_00143c6e;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}